

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.cpp
# Opt level: O0

ssize_t __thiscall
psy::C::SyntaxWriterDOTFormat::write(SyntaxWriterDOTFormat *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined1 local_250 [8];
  ofstream ofs;
  undefined1 local_40 [8];
  string basename;
  string *fileSuffix_local;
  SyntaxNode *node_local;
  SyntaxWriterDOTFormat *this_local;
  
  basename.field_2._8_8_ = __buf;
  SyntaxTree::filePath_abi_cxx11_
            ((string *)local_40,(this->super_SyntaxDumper).super_SyntaxVisitor.tree_);
  std::__cxx11::string::append((string *)local_40);
  std::ofstream::ofstream(local_250,local_40,0x10);
  write(this,__fd,(void *)basename.field_2._8_8_,(size_t)local_250);
  std::ofstream::close();
  std::ofstream::~ofstream(local_250);
  sVar1 = std::__cxx11::string::~string((string *)local_40);
  return sVar1;
}

Assistant:

void SyntaxWriterDOTFormat::write(const SyntaxNode* node,
                                  const std::string& fileSuffix)
{
    std::string basename = tree_->filePath();
    basename.append(fileSuffix);
    std::ofstream ofs(basename);
    write(node, fileSuffix, ofs);
    ofs.close();
}